

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharedRenderingPerfTests.cpp
# Opt level: O1

GLuint deqp::egl::anon_unknown_0::anon_unknown_5::createTexture(Functions *gl,TestConfig *config)

{
  long lVar1;
  GLenum GVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uchar local_6d;
  int local_6c;
  int local_68;
  GLuint texture;
  TestConfig *local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < config->textureWidth) {
    local_68 = 0;
    local_6c = 0;
    local_60 = config;
    do {
      if (0 < local_60->textureHeight) {
        lVar1 = (long)(local_6c * 0xff) * 0x80808081;
        iVar4 = 0;
        iVar5 = 0;
        iVar3 = 0;
        do {
          local_6d = (char)(uint)((ulong)lVar1 >> 0x27) - (char)(lVar1 >> 0x3f);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    (&data,&local_6d);
          local_6d = (char)(uint)((ulong)((long)iVar4 * 0x80808081) >> 0x27) -
                     (char)((long)iVar4 * 0x80808081 >> 0x3f);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    (&data,&local_6d);
          local_6d = (char)(uint)((ulong)((long)iVar5 * 0x81018203) >> 0x2f) -
                     (char)((long)iVar5 * 0x81018203 >> 0x3f);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    (&data,&local_6d);
          local_6d = 0xff;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    (&data,&local_6d);
          iVar3 = iVar3 + 1;
          iVar5 = iVar5 + local_68;
          iVar4 = iVar4 + 0xff;
        } while (iVar3 < local_60->textureHeight);
      }
      local_6c = local_6c + 1;
      local_68 = local_68 + 0xff;
      config = local_60;
    } while (local_6c < local_60->textureWidth);
  }
  (*gl->genTextures)(1,&texture);
  GVar2 = (*gl->getError)();
  glu::checkError(GVar2,"glGenTextures()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharedRenderingPerfTests.cpp"
                  ,0x119);
  (*gl->bindTexture)(0xde1,texture);
  GVar2 = (*gl->getError)();
  glu::checkError(GVar2,"glBindTexture()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharedRenderingPerfTests.cpp"
                  ,0x11b);
  (*gl->texParameteri)(0xde1,0x2801,0x2601);
  GVar2 = (*gl->getError)();
  glu::checkError(GVar2,"glTexParameteri",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharedRenderingPerfTests.cpp"
                  ,0x11d);
  (*gl->texParameteri)(0xde1,0x2800,0x2601);
  GVar2 = (*gl->getError)();
  glu::checkError(GVar2,"glTexParameteri",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharedRenderingPerfTests.cpp"
                  ,0x11f);
  (*gl->texParameteri)(0xde1,0x2803,0x812f);
  GVar2 = (*gl->getError)();
  glu::checkError(GVar2,"glTexParameteri",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharedRenderingPerfTests.cpp"
                  ,0x121);
  (*gl->texParameteri)(0xde1,0x2802,0x812f);
  GVar2 = (*gl->getError)();
  glu::checkError(GVar2,"glTexParameteri",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharedRenderingPerfTests.cpp"
                  ,0x123);
  (*gl->texImage2D)(0xde1,0,0x1908,config->textureWidth,config->textureWidth,0,0x1908,0x1401,
                    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  GVar2 = (*gl->getError)();
  glu::checkError(GVar2,"glTexImage2D()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharedRenderingPerfTests.cpp"
                  ,0x125);
  (*gl->bindTexture)(0xde1,0);
  GVar2 = (*gl->getError)();
  glu::checkError(GVar2,"glBindTexture()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharedRenderingPerfTests.cpp"
                  ,0x127);
  if (data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return texture;
}

Assistant:

GLuint createTexture (const glw::Functions& gl, const TestConfig& config)
{
	GLuint			texture;
	vector<deUint8>	data;

	createTextureData(data, config);

	gl.genTextures(1, &texture);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures()");
	gl.bindTexture(GL_TEXTURE_2D, texture);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture()");
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri");
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri");
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri");
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri");
	gl.texImage2D(GL_TEXTURE_2D, 0, GL_RGBA, config.textureWidth, config.textureWidth, 0, GL_RGBA, GL_UNSIGNED_BYTE, &(data[0]));
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage2D()");
	gl.bindTexture(GL_TEXTURE_2D, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture()");

	return texture;
}